

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::WriteName(WalletBatch *this,string *strAddress,string *strName)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DBKeys::NAME_abi_cxx11_,strAddress);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string>
                    (this,&local_60,strName,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
    operator_delete(local_60.second._M_dataplus._M_p,
                    local_60.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteName(const std::string& strAddress, const std::string& strName)
{
    return WriteIC(std::make_pair(DBKeys::NAME, strAddress), strName);
}